

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IT8951.c
# Opt level: O1

void LCDSendCmdArg(uint16_t usCmdCode,uint16_t *pArg,uint16_t usNumArg)

{
  undefined2 in_register_00000012;
  ulong uVar1;
  
  LCDWriteCmdCode(usCmdCode);
  if (CONCAT22(in_register_00000012,usNumArg) != 0) {
    uVar1 = 0;
    do {
      LCDWriteData(pArg[uVar1]);
      uVar1 = uVar1 + 1;
    } while (usNumArg != uVar1);
  }
  return;
}

Assistant:

void LCDSendCmdArg(uint16_t usCmdCode,uint16_t* pArg, uint16_t usNumArg)
{
     uint16_t i;
     //Send Cmd code
     LCDWriteCmdCode(usCmdCode);
     //Send Data
     for(i=0;i<usNumArg;i++)
     {
         LCDWriteData(pArg[i]);
     }
}